

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

void * SZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  PHYSFS_ErrorCode PVar2;
  PHYSFS_uint64 PVar3;
  PHYSFS_sint64 PVar4;
  PHYSFS_sint64 pos;
  undefined1 auStack_4094 [2];
  PHYSFS_uint8 sig [6];
  SRes rc;
  SZIPinfo *info;
  ISzAlloc *alloc;
  SZIPLookToRead stream;
  int *claimed_local;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  stack0xffffffffffffbf70 = (SZIPinfo *)0x0;
  stream.lookStream.buf._16376_8_ = claimed;
  if (forWriting == 0) {
    PVar3 = (*io->tell)(io);
    if ((PVar3 != 0xffffffffffffffff) &&
       (PVar4 = (*io->read)(io,(void *)((long)&pos + 6),6), PVar4 == 6)) {
      iVar1 = memcmp((void *)((long)&pos + 6),SZIP_openArchive::wantedsig,6);
      *(uint *)stream.lookStream.buf._16376_8_ = (uint)(iVar1 == 0);
      iVar1 = (*io->seek)(io,PVar3);
      if (iVar1 != 0) {
        register0x00000000 = (SZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x108);
        if (register0x00000000 == (SZIPinfo *)0x0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          memset(register0x00000000,0,0x108);
          SzArEx_Init(&stack0xffffffffffffbf70->db);
          stack0xffffffffffffbf70->io = io;
          szipInitStream((SZIPLookToRead *)&alloc,io);
          _auStack_4094 =
               SzArEx_Open(&stack0xffffffffffffbf70->db,(ILookInStream *)&stream.io,&SZIP_SzAlloc,
                           &SZIP_SzAlloc);
          if (_auStack_4094 == 0) {
            iVar1 = szipLoadEntries(stack0xffffffffffffbf70);
            if (iVar1 != 0) {
              return stack0xffffffffffffbf70;
            }
          }
          else {
            PVar2 = szipErrorCode(_auStack_4094);
            if (PVar2 != PHYSFS_ERR_OK) {
              PVar2 = szipErrorCode(_auStack_4094);
              PHYSFS_setErrorCode(PVar2);
            }
          }
          stack0xffffffffffffbf70->io = (PHYSFS_Io *)0x0;
          SZIP_closeArchive(stack0xffffffffffffbf70);
        }
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
  }
  return (void *)0x0;
}

Assistant:

static void *SZIP_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    static const PHYSFS_uint8 wantedsig[] = { '7','z',0xBC,0xAF,0x27,0x1C };
    SZIPLookToRead stream;
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPinfo *info = NULL;
    SRes rc;
    PHYSFS_uint8 sig[6];
    PHYSFS_sint64 pos;

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    pos = io->tell(io);
    BAIL_IF_ERRPASS(pos == -1, NULL);
    BAIL_IF_ERRPASS(io->read(io, sig, 6) != 6, NULL);
    *claimed = (memcmp(sig, wantedsig, 6) == 0);
    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    info = (SZIPinfo *) allocator.Malloc(sizeof (SZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (*info));

    SzArEx_Init(&info->db);

    info->io = io;

    szipInitStream(&stream, io);
    rc = SzArEx_Open(&info->db, &stream.lookStream.s, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), failed);

    GOTO_IF_ERRPASS(!szipLoadEntries(info), failed);

    return info;

failed:
    info->io = NULL;  /* don't let cleanup destroy the PHYSFS_Io. */
    SZIP_closeArchive(info);
    return NULL;
}